

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

MemoryInstanceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemoryInstanceInfo
          (MemoryInstanceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  bool bVar1;
  Importable *this_00;
  ModuleRunner *pMVar2;
  __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar3;
  long lVar4;
  ModuleRunnerBase<wasm::ModuleRunner> *this_02;
  char *pcVar5;
  Name NVar6;
  Name NVar7;
  Export *memoryExport;
  mapped_type *importedInstance;
  MemoryInstanceInfo memoryInterfaceInfo;
  Memory *memory;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  pcVar5 = name.super_IString.str._M_len;
  NVar6.super_IString.str._M_str = pcVar5;
  NVar6.super_IString.str._M_len = (size_t)this->wasm;
  memoryInterfaceInfo.name.super_IString.str._M_str = pcVar5;
  this_00 = (Importable *)::wasm::Module::getMemory(NVar6);
  MemoryInstanceInfo::MemoryInstanceInfo((MemoryInstanceInfo *)&importedInstance);
  bVar1 = Importable::imported(this_00);
  if (bVar1) {
    this_01 = (__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              ::at(&this->linkedInstances,&this_00->module);
    peVar3 = std::__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    NVar7.super_IString.str._M_str = (char *)(this_00->base).super_IString.str._M_len;
    NVar7.super_IString.str._M_len =
         (size_t)(peVar3->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
    lVar4 = ::wasm::Module::getExport(NVar7);
    this_02 = &std::
               __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01)->super_ModuleRunnerBase<wasm::ModuleRunner>;
    getMemoryInstanceInfo(__return_storage_ptr__,this_02,(Name)((IString *)(lVar4 + 0x10))->str);
  }
  else {
    pMVar2 = self(this);
    __return_storage_ptr__->instance = pMVar2;
    (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)pcVar5;
    (__return_storage_ptr__->name).super_IString.str._M_str = name.super_IString.str._M_str;
  }
  return __return_storage_ptr__;
}

Assistant:

MemoryInstanceInfo getMemoryInstanceInfo(Name name) {
    auto* memory = wasm.getMemory(name);
    MemoryInstanceInfo memoryInterfaceInfo;
    if (!memory->imported()) {
      return MemoryInstanceInfo{self(), name};
    }

    auto& importedInstance = linkedInstances.at(memory->module);
    auto* memoryExport = importedInstance->wasm.getExport(memory->base);
    return importedInstance->getMemoryInstanceInfo(memoryExport->value);
  }